

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceDescriptor
          (Generator *this,ServiceDescriptor *descriptor)

{
  MethodDescriptor *this_00;
  long lVar1;
  mapped_type *pmVar2;
  Descriptor *pDVar3;
  long lVar4;
  AlphaNum *a;
  AlphaNum *a_00;
  char *pcVar5;
  char *pcVar6;
  byte bVar7;
  allocator local_1e9;
  long local_1e8;
  Generator *local_1e0;
  string local_1d8;
  ServiceDescriptor *local_1b8;
  long local_1b0;
  AlphaNum local_1a8;
  string options_string;
  ServiceDescriptorProto sdp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  char required_function_arguments [105];
  string service_name;
  key_type local_50;
  
  bVar7 = 0;
  io::Printer::Print<>(this->printer_,"\n");
  ModuleLevelServiceDescriptorName_abi_cxx11_(&service_name,this,descriptor);
  options_string._M_dataplus._M_p = (pointer)&options_string.field_2;
  options_string._M_string_length = 0;
  options_string.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString(*(MessageLite **)(descriptor + 0x18),&options_string);
  io::Printer::Print<char[13],std::__cxx11::string>
            (this->printer_,"$service_name$ = _descriptor.ServiceDescriptor(\n",
             (char (*) [13])"service_name",&service_name);
  io::Printer::Indent(this->printer_);
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)required_function_arguments,"name",(allocator *)&sdp);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)required_function_arguments);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::~string((string *)required_function_arguments);
  std::__cxx11::string::string((string *)required_function_arguments,"full_name",(allocator *)&sdp);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)required_function_arguments);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::~string((string *)required_function_arguments);
  std::__cxx11::string::string((string *)required_function_arguments,"file",(allocator *)&sdp);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)required_function_arguments);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)required_function_arguments);
  strings::AlphaNum::AlphaNum
            ((AlphaNum *)required_function_arguments,
             (int)(((long)descriptor - *(long *)(*(long *)(descriptor + 0x10) + 0x78)) / 0x30));
  StrCat_abi_cxx11_((string *)&sdp,(protobuf *)required_function_arguments,a);
  std::__cxx11::string::string((string *)&local_1a8,"index",(allocator *)&local_1d8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&local_1a8);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&sdp);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&sdp);
  OptionsValue((string *)required_function_arguments,this,&options_string);
  std::__cxx11::string::string((string *)&sdp,"options_value",(allocator *)&local_1a8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&sdp);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)required_function_arguments);
  std::__cxx11::string::~string((string *)&sdp);
  std::__cxx11::string::~string((string *)required_function_arguments);
  pcVar5 = 
  "name=\'$name$\',\nfull_name=\'$full_name$\',\nfile=$file$,\nindex=$index$,\nserialized_options=$options_value$,\n"
  ;
  pcVar6 = required_function_arguments;
  for (lVar4 = 0x69; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pcVar6 = *pcVar5;
    pcVar5 = pcVar5 + (ulong)bVar7 * -2 + 1;
    pcVar6 = pcVar6 + (ulong)bVar7 * -2 + 1;
  }
  io::Printer::Print(this->printer_,&m,required_function_arguments);
  ServiceDescriptorProto::ServiceDescriptorProto(&sdp);
  PrintSerializedPbInterval<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>
            (this,descriptor,&sdp);
  io::Printer::Print<>(this->printer_,"methods=[\n");
  local_1e8 = 0;
  lVar4 = 0;
  local_1e0 = this;
  local_1b8 = descriptor;
  while (lVar4 < *(int *)(descriptor + 0x28)) {
    lVar1 = *(long *)(descriptor + 0x20);
    local_1b0 = lVar4;
    MessageLite::SerializeToString(*(MessageLite **)(lVar1 + 0x58 + local_1e8),&options_string);
    this_00 = (MethodDescriptor *)(lVar1 + local_1e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&m._M_t);
    std::__cxx11::string::string((string *)&local_1a8,"name",(allocator *)&local_1d8);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&m._M_t,(key_type *)&local_1a8);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::string((string *)&local_1a8,"full_name",(allocator *)&local_1d8);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&m._M_t,(key_type *)&local_1a8);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_1a8);
    strings::AlphaNum::AlphaNum
              (&local_1a8,
               (int)(((lVar1 - *(long *)(*(long *)(lVar1 + 0x10 + local_1e8) + 0x20)) + local_1e8) /
                    0x68));
    StrCat_abi_cxx11_(&local_1d8,(protobuf *)&local_1a8,a_00);
    std::__cxx11::string::string((string *)&local_50,"index",&local_1e9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&m._M_t,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_1d8);
    CEscape((string *)&local_1a8,&options_string);
    std::__cxx11::string::string((string *)&local_1d8,"serialized_options",(allocator *)&local_50);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&m._M_t,&local_1d8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1a8);
    pDVar3 = MethodDescriptor::input_type(this_00);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)&local_1a8,local_1e0,pDVar3);
    std::__cxx11::string::string((string *)&local_1d8,"input_type",(allocator *)&local_50);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&m._M_t,&local_1d8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1a8);
    pDVar3 = MethodDescriptor::output_type(this_00);
    this = local_1e0;
    ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)&local_1a8,local_1e0,pDVar3);
    std::__cxx11::string::string((string *)&local_1d8,"output_type",(allocator *)&local_50);
    descriptor = local_1b8;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&m._M_t,&local_1d8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1a8);
    OptionsValue((string *)&local_1a8,this,&options_string);
    std::__cxx11::string::string((string *)&local_1d8,"options_value",(allocator *)&local_50);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&m._M_t,&local_1d8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1a8);
    io::Printer::Print<>(this->printer_,"_descriptor.MethodDescriptor(\n");
    io::Printer::Indent(this->printer_);
    io::Printer::Print(this->printer_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&m._M_t,
                       "name=\'$name$\',\nfull_name=\'$full_name$\',\nindex=$index$,\ncontaining_service=None,\ninput_type=$input_type$,\noutput_type=$output_type$,\nserialized_options=$options_value$,\n"
                      );
    io::Printer::Outdent(this->printer_);
    io::Printer::Print<>(this->printer_,"),\n");
    local_1e8 = local_1e8 + 0x68;
    lVar4 = local_1b0 + 1;
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print<>(this->printer_,"])\n");
  io::Printer::Print<char[5],std::__cxx11::string>
            (this->printer_,"_sym_db.RegisterServiceDescriptor($name$)\n",(char (*) [5])0x38d8c6,
             &service_name);
  io::Printer::Print<>(this->printer_,"\n");
  ServiceDescriptorProto::~ServiceDescriptorProto(&sdp);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m._M_t);
  std::__cxx11::string::~string((string *)&options_string);
  std::__cxx11::string::~string((string *)&service_name);
  return;
}

Assistant:

void Generator::PrintServiceDescriptor(
    const ServiceDescriptor& descriptor) const {
  printer_->Print("\n");
  std::string service_name = ModuleLevelServiceDescriptorName(descriptor);
  std::string options_string;
  descriptor.options().SerializeToString(&options_string);

  printer_->Print("$service_name$ = _descriptor.ServiceDescriptor(\n",
                  "service_name", service_name);
  printer_->Indent();
  std::map<std::string, std::string> m;
  m["name"] = descriptor.name();
  m["full_name"] = descriptor.full_name();
  m["file"] = kDescriptorKey;
  m["index"] = StrCat(descriptor.index());
  m["options_value"] = OptionsValue(options_string);
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "file=$file$,\n"
      "index=$index$,\n"
      "serialized_options=$options_value$,\n";
  printer_->Print(m, required_function_arguments);

  ServiceDescriptorProto sdp;
  PrintSerializedPbInterval(descriptor, sdp);

  printer_->Print("methods=[\n");
  for (int i = 0; i < descriptor.method_count(); ++i) {
    const MethodDescriptor* method = descriptor.method(i);
    method->options().SerializeToString(&options_string);

    m.clear();
    m["name"] = method->name();
    m["full_name"] = method->full_name();
    m["index"] = StrCat(method->index());
    m["serialized_options"] = CEscape(options_string);
    m["input_type"] = ModuleLevelDescriptorName(*(method->input_type()));
    m["output_type"] = ModuleLevelDescriptorName(*(method->output_type()));
    m["options_value"] = OptionsValue(options_string);
    printer_->Print("_descriptor.MethodDescriptor(\n");
    printer_->Indent();
    printer_->Print(m,
                    "name='$name$',\n"
                    "full_name='$full_name$',\n"
                    "index=$index$,\n"
                    "containing_service=None,\n"
                    "input_type=$input_type$,\n"
                    "output_type=$output_type$,\n"
                    "serialized_options=$options_value$,\n");
    printer_->Outdent();
    printer_->Print("),\n");
  }

  printer_->Outdent();
  printer_->Print("])\n");
  printer_->Print("_sym_db.RegisterServiceDescriptor($name$)\n", "name",
                  service_name);
  printer_->Print("\n");
}